

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O2

void prvTidygrowStack(Stack *stack)

{
  uint uVar1;
  Node **__dest;
  
  uVar1 = stack->capacity * 2;
  __dest = (Node **)(*stack->allocator->vtbl->alloc)(stack->allocator,(ulong)uVar1 * 8);
  memcpy(__dest,stack->firstNode,(long)stack->top * 8 + 8);
  (*stack->allocator->vtbl->free)(stack->allocator,stack->firstNode);
  stack->firstNode = __dest;
  stack->capacity = uVar1;
  return;
}

Assistant:

void TY_(growStack)(Stack *stack)
{
    uint new_capacity = stack->capacity * 2;
    
    Node **firstNode = (Node **)TidyAlloc(stack->allocator, new_capacity * sizeof(Node**));
    
    memcpy( firstNode, stack->firstNode, sizeof(Node**) * (stack->top + 1) );
    TidyFree(stack->allocator, stack->firstNode);

    stack->firstNode = firstNode;
    stack->capacity = new_capacity;
}